

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
          (EpsCopyOutputStream *this,void *data,int size,uint8 *ptr)

{
  ptrdiff_t pVar1;
  uint8 *in_RCX;
  int in_EDX;
  void *in_RSI;
  int s;
  uint8 *in_stack_000000d0;
  EpsCopyOutputStream *in_stack_000000d8;
  int local_24;
  uint8 *local_20;
  int local_14;
  void *local_10;
  
  pVar1 = GetSize(this,(uint8 *)data);
  local_24 = (int)pVar1;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  while (local_24 < local_14) {
    memcpy(local_20,local_10,(long)local_24);
    local_14 = local_14 - local_24;
    local_10 = (void *)((long)local_10 + (long)local_24);
    local_20 = EnsureSpaceFallback(in_stack_000000d8,in_stack_000000d0);
    pVar1 = GetSize(this,(uint8 *)data);
    local_24 = (int)pVar1;
  }
  memcpy(local_20,local_10,(long)local_14);
  return local_20 + local_14;
}

Assistant:

uint8* EpsCopyOutputStream::WriteRawFallback(const void* data, int size,
                                             uint8* ptr) {
  int s = GetSize(ptr);
  while (s < size) {
    std::memcpy(ptr, data, s);
    size -= s;
    data = static_cast<const uint8*>(data) + s;
    ptr = EnsureSpaceFallback(ptr + s);
    s = GetSize(ptr);
  }
  std::memcpy(ptr, data, size);
  return ptr + size;
}